

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_crypto.c
# Opt level: O0

void i2p_dest_tob32addr(i2p_dest *dest,char *buf,size_t sz)

{
  size_t sVar1;
  size_t in_RDX;
  char *in_RSI;
  uchar *in_RDI;
  uint8_t digest [32];
  size_t len;
  uchar auStack_48 [48];
  size_t local_18;
  char *local_10;
  
  if (*(ulong *)(in_RDI + 0x200) < 0x201) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    SHA256(in_RDI,*(size_t *)(in_RDI + 0x200),auStack_48);
    sVar1 = ByteStreamToBase32(auStack_48,0x20,local_10,local_18);
    builtin_strncpy(local_10 + sVar1,".b32.i2p",9);
    (local_10 + sVar1 + 8)[1] = '\0';
    return;
  }
  __assert_fail("dest->sz <= sizeof(dest->buf)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/majestrate[P]trans2p/src/i2p_crypto.c"
                ,0x68,"void i2p_dest_tob32addr(struct i2p_dest *, char *, size_t)");
}

Assistant:

void i2p_dest_tob32addr(struct i2p_dest * dest, char * buf, size_t sz)
{
  assert(dest->sz <= sizeof(dest->buf));
  size_t len;
  uint8_t digest[32];
  SHA256(dest->buf, dest->sz, digest);
  len = ByteStreamToBase32(digest, 32, buf, sz);
  memcpy(buf + len, ".b32.i2p", 10);
}